

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location)

{
  int line;
  bool bVar1;
  char *test_name;
  char *file;
  anon_class_72_2_4f66548f_for_factory_ local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string full_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string message;
  _Self local_28;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ignored;
  CodeLocation *location_local;
  string *name_local;
  
  ignored = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)location;
  location_local = (CodeLocation *)name;
  local_20 = GetIgnoredParameterizedTestSuites_abi_cxx11_();
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(local_20,&location_local->file);
  message.field_2._8_8_ =
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(local_20);
  bVar1 = std::operator!=(&local_28,(_Self *)((long)&message.field_2 + 8));
  if (!bVar1) {
    std::operator+(&local_b0,"Paramaterized test suite ",&location_local->file);
    std::operator+(&local_90,&local_b0,
                   " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)\n\nTo suppress this error for this test suite, insert the following line (in a non-header) in the namespace it is defined in:\n\nGTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST("
                  );
    std::operator+(&local_70,&local_90,&location_local->file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,");");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+(&local_100,"UninstantiatedParamaterizedTestSuite<",&location_local->file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   &local_100,">");
    std::__cxx11::string::~string((string *)&local_100);
    test_name = (char *)std::__cxx11::string::c_str();
    file = (char *)std::__cxx11::string::c_str();
    line = location->line;
    std::__cxx11::string::string((string *)&local_148,(string *)local_50);
    CodeLocation::CodeLocation(&local_148.location,location);
    RegisterTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_IAMColumbia[P]cpp2_demo_gtest_googletest_src_gtest_cc:482:45)>
              ("GoogleTestVerification",test_name,(char *)0x0,(char *)0x0,file,line,&local_148);
    InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation)::$_0::~__0
              ((__0 *)&local_148);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string &name, CodeLocation location) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  std::string message =
      "Paramaterized test suite " + name +
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)"
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" + name + ");";

  std::string full_name = "UninstantiatedParamaterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}